

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O2

Gia_Man_t * Gia_ManDupCofInt(Gia_Man_t *p,int iVar)

{
  ulong uVar1;
  Vec_Int_t *p_00;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Gia_Obj_t *pGVar7;
  Gia_Man_t *p_01;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Gia_Obj_t *pGVar10;
  uint local_3c;
  
  if (iVar < 1 || p->nObjs <= iVar) {
    p_01 = (Gia_Man_t *)0x0;
    printf("Gia_ManDupCof(): Variable %d is out of range (%d; %d).\n",iVar,0);
  }
  else {
    pGVar7 = Gia_ManObj(p,iVar);
    iVar2 = Gia_ObjIsCand(pGVar7);
    if (iVar2 == 0) {
      p_01 = (Gia_Man_t *)0x0;
      printf("Gia_ManDupCof(): Variable %d should be a CI or an AND node.\n",iVar);
    }
    else {
      p_01 = Gia_ManStart(p->nObjs);
      pcVar8 = Abc_UtilStrsav(p->pName);
      p_01->pName = pcVar8;
      pcVar8 = Abc_UtilStrsav(p->pSpec);
      p_01->pSpec = pcVar8;
      Gia_ManHashAlloc(p_01);
      Gia_ManFillValue(p);
      p->pObjs->Value = 0;
      local_3c = 0xffffffff;
      iVar2 = 0;
      while ((iVar2 < p->vCis->nSize && (pGVar9 = Gia_ManCi(p,iVar2), pGVar9 != (Gia_Obj_t *)0x0)))
      {
        pGVar10 = Gia_ManAppendObj(p_01);
        uVar1 = *(ulong *)pGVar10;
        *(ulong *)pGVar10 = uVar1 | 0x9fffffff;
        *(ulong *)pGVar10 =
             uVar1 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
        p_00 = p_01->vCis;
        iVar3 = Gia_ObjId(p_01,pGVar10);
        Vec_IntPush(p_00,iVar3);
        iVar3 = Gia_ObjId(p_01,pGVar10);
        uVar6 = iVar3 * 2;
        if (pGVar9 == pGVar7) {
          uVar6 = 0;
          local_3c = iVar3 * 2;
        }
        pGVar9->Value = uVar6;
        iVar2 = iVar2 + 1;
      }
      iVar2 = 0;
      while ((iVar2 < p->nObjs && (pGVar9 = Gia_ManObj(p,iVar2), pGVar9 != (Gia_Obj_t *)0x0))) {
        if ((~*(uint *)pGVar9 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar9) {
          iVar3 = Gia_ObjFanin0Copy(pGVar9);
          iVar4 = Gia_ObjFanin1Copy(pGVar9);
          uVar5 = Gia_ManHashAnd(p_01,iVar3,iVar4);
          uVar6 = uVar5;
          if (pGVar9 == pGVar7) {
            uVar6 = 0;
            local_3c = uVar5;
          }
          pGVar9->Value = uVar6;
        }
        iVar2 = iVar2 + 1;
      }
      iVar2 = 0;
      while ((iVar2 < p->vCos->nSize && (pGVar9 = Gia_ManCo(p,iVar2), pGVar9 != (Gia_Obj_t *)0x0)))
      {
        uVar6 = Gia_ObjFanin0Copy(pGVar9);
        pGVar9->Value = uVar6;
        iVar2 = iVar2 + 1;
      }
      iVar2 = 0;
      while ((iVar2 < p->vCis->nSize && (pGVar9 = Gia_ManCi(p,iVar2), pGVar9 != (Gia_Obj_t *)0x0)))
      {
        pGVar10 = Gia_ManCi(p_01,iVar2);
        iVar3 = Gia_ObjId(p_01,pGVar10);
        uVar6 = Abc_Var2Lit(iVar3,0);
        if (pGVar9 == pGVar7) {
          uVar6 = 1;
        }
        pGVar9->Value = uVar6;
        iVar2 = iVar2 + 1;
      }
      iVar2 = 0;
      while ((iVar2 < p->nObjs && (pGVar9 = Gia_ManObj(p,iVar2), pGVar9 != (Gia_Obj_t *)0x0))) {
        if ((~*(uint *)pGVar9 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar9) {
          iVar3 = Gia_ObjFanin0Copy(pGVar9);
          iVar4 = Gia_ObjFanin1Copy(pGVar9);
          uVar6 = Gia_ManHashAnd(p_01,iVar3,iVar4);
          if (pGVar9 == pGVar7) {
            uVar6 = 1;
          }
          pGVar9->Value = uVar6;
        }
        iVar2 = iVar2 + 1;
      }
      if ((int)local_3c < 1) {
        __assert_fail("iCofVar > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCof.c"
                      ,0x346,"Gia_Man_t *Gia_ManDupCofInt(Gia_Man_t *, int)");
      }
      iVar2 = 0;
      while ((iVar2 < p->vCos->nSize && (pGVar7 = Gia_ManCo(p,iVar2), pGVar7 != (Gia_Obj_t *)0x0)))
      {
        uVar6 = pGVar7->Value;
        uVar5 = Gia_ObjFanin0Copy(pGVar7);
        iVar3 = Gia_ObjFanin0Copy(pGVar7);
        if (uVar6 != uVar5) {
          iVar3 = Gia_ManHashMux(p_01,local_3c,iVar3,pGVar7->Value);
        }
        uVar6 = Gia_ManAppendCo(p_01,iVar3);
        pGVar7->Value = uVar6;
        iVar2 = iVar2 + 1;
      }
      Gia_ManHashStop(p_01);
      Gia_ManSetRegNum(p_01,p->nRegs);
    }
  }
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManDupCofInt( Gia_Man_t * p, int iVar )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj, * pPivot;
    int i, iCofVar = -1;
    if ( !(iVar > 0 && iVar < Gia_ManObjNum(p)) )
    {
        printf( "Gia_ManDupCof(): Variable %d is out of range (%d; %d).\n", iVar, 0, Gia_ManObjNum(p) );
        return NULL;
    }
    // find the cofactoring variable
    pPivot = Gia_ManObj( p, iVar );
    if ( !Gia_ObjIsCand(pPivot) )
    {
        printf( "Gia_ManDupCof(): Variable %d should be a CI or an AND node.\n", iVar );
        return NULL;
    }
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    // compute negative cofactor
    Gia_ManForEachCi( p, pObj, i )
    {
        pObj->Value = Gia_ManAppendCi(pNew);
        if ( pObj == pPivot )
        {
            iCofVar = pObj->Value;
            pObj->Value = Abc_Var2Lit( 0, 0 );
        }
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( pObj == pPivot )
        {
            iCofVar = pObj->Value;
            pObj->Value = Abc_Var2Lit( 0, 0 );
        }
    }
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    // compute the positive cofactor
    Gia_ManForEachCi( p, pObj, i )
    {
        pObj->Value = Abc_Var2Lit( Gia_ObjId(pNew, Gia_ManCi(pNew, i)), 0 );
        if ( pObj == pPivot )
            pObj->Value = Abc_Var2Lit( 0, 1 );
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( pObj == pPivot )
            pObj->Value = Abc_Var2Lit( 0, 1 );
    }
    // create MUXes
    assert( iCofVar > 0 );
    Gia_ManForEachCo( p, pObj, i )
    {
        if ( pObj->Value == (unsigned)Gia_ObjFanin0Copy(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ManHashMux(pNew, iCofVar, Gia_ObjFanin0Copy(pObj), pObj->Value) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}